

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O0

XmlWriter * __thiscall
Catch::XmlWriter::writeAttribute<char[1]>(XmlWriter *this,string *name,char (*attribute) [1])

{
  ulong uVar1;
  ostream *poVar2;
  ostream *poVar3;
  char (*attribute_local) [1];
  string *name_local;
  XmlWriter *this_local;
  
  uVar1 = std::__cxx11::string::empty();
  if ((uVar1 & 1) == 0) {
    poVar2 = stream(this);
    poVar3 = std::operator<<((ostream *)poVar2," ");
    poVar3 = std::operator<<(poVar3,(string *)name);
    poVar3 = std::operator<<(poVar3,"=\"");
    poVar3 = std::operator<<(poVar3,*attribute);
    std::operator<<(poVar3,"\"");
  }
  return this;
}

Assistant:

XmlWriter& writeAttribute( std::string const& name, T const& attribute ) {
            if( !name.empty() )
                stream() << " " << name << "=\"" << attribute << "\"";
            return *this;
        }